

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::RoundCase::compare(RoundCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  pointer pSVar2;
  void *pvVar3;
  void *pvVar4;
  deUint32 aBits;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ostringstream *poVar11;
  float fVar12;
  ulong uVar13;
  deUint32 u32;
  float fVar14;
  float fVar15;
  float fVar16;
  deUint32 bBits_2;
  deUint32 u32_1;
  float fVar17;
  float __x;
  HexFloat local_54;
  Hex<8UL> local_50;
  ulong local_48;
  void *local_40;
  HexFloat local_34;
  
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  uVar5 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (PVar1 - PRECISION_MEDIUMP < 2) {
    if (0 < (int)uVar5) {
      pvVar3 = *inputs;
      pvVar4 = *outputs;
      uVar13 = 0;
      do {
        fVar12 = *(float *)((long)pvVar3 + uVar13 * 4);
        fVar15 = *(float *)((long)pvVar4 + uVar13 * 4);
        fVar14 = floorf(fVar12);
        fVar17 = fVar12 - fVar14;
        if ((fVar17 != 0.5) || (NAN(fVar17))) {
          iVar8 = (uint)(0.5 < fVar17) + (int)(fVar12 - fVar17);
          fVar14 = (float)iVar8;
          if (PVar1 == PRECISION_HIGHP) {
LAB_0046a378:
            fVar12 = (float)((int)fVar14 - (int)fVar15);
            if ((uint)fVar14 < (uint)fVar15) {
              fVar12 = (float)-((int)fVar14 - (int)fVar15);
            }
          }
          else if ((fVar15 != 0.0) || (NAN(fVar15))) {
            if (iVar8 != 0) goto LAB_0046a378;
            fVar12 = ABS(fVar15);
          }
          else {
            fVar12 = ABS(fVar14);
          }
          if (fVar12 != 0.0) {
            poVar11 = &(this->super_CommonFunctionCase).m_failMsg;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"Expected [",10);
            poVar7 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = ",4);
            local_54.value = fVar14;
            poVar7 = Functional::operator<<(poVar7,&local_54);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", got ULP diff ",0xf);
LAB_0046a72a:
            local_50.value._4_4_ = 0;
            local_50.value._0_4_ = fVar12;
            tcu::Format::Hex<8UL>::toStream(&local_50,poVar7);
            return false;
          }
        }
        else {
          fVar17 = ceilf(fVar12);
          if (PVar1 == PRECISION_HIGHP) {
            fVar12 = (float)((int)fVar17 - (int)fVar15);
            if ((uint)fVar17 < (uint)fVar15) {
              fVar12 = (float)-((int)fVar17 - (int)fVar15);
            }
            fVar16 = (float)((int)fVar14 - (int)fVar15);
            if ((uint)fVar14 < (uint)fVar15) {
              fVar16 = (float)-((int)fVar14 - (int)fVar15);
            }
          }
          else if ((fVar15 != 0.0) || (NAN(fVar15))) {
            if ((fVar14 != 0.0) || (NAN(fVar14))) {
              fVar16 = (float)((int)fVar14 - (int)fVar15);
              if ((uint)fVar14 < (uint)fVar15) {
                fVar16 = (float)-((int)fVar14 - (int)fVar15);
              }
            }
            else {
              fVar16 = ABS(fVar15);
            }
            if ((fVar17 != 0.0) || (NAN(fVar17))) {
              fVar12 = (float)((int)fVar17 - (int)fVar15);
              if ((uint)fVar17 < (uint)fVar15) {
                fVar12 = (float)-((int)fVar17 - (int)fVar15);
              }
            }
            else {
              fVar12 = ABS(fVar15);
            }
          }
          else {
            fVar16 = ABS(fVar14);
            fVar12 = ABS(fVar17);
          }
          if ((fVar16 != 0.0) && (fVar12 != 0.0)) {
            poVar11 = &(this->super_CommonFunctionCase).m_failMsg;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"Expected [",10);
            poVar7 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = ",4);
            local_54.value = fVar14;
            poVar7 = Functional::operator<<(poVar7,&local_54);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," or ",4);
            local_34.value = fVar17;
            poVar7 = Functional::operator<<(poVar7,&local_34);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", got ULP diff ",0xf);
            if ((uint)fVar16 < (uint)fVar12) {
              fVar12 = fVar16;
            }
            goto LAB_0046a72a;
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar5 != uVar13);
    }
  }
  else {
    uVar9 = -1 << (0x17 - (&DAT_0096a1bc)[(ulong)PVar1 * 4] & 0x1f);
    if (0 < (int)uVar5) {
      fVar12 = (float)~uVar9;
      fVar15 = (float)(uVar9 & 0x7fffff ^ 0x3fffffff) + -1.0;
      local_40 = *inputs;
      pvVar3 = *outputs;
      local_48 = (ulong)uVar5;
      uVar13 = 0;
      do {
        fVar14 = *(float *)((long)local_40 + uVar13 * 4);
        fVar17 = *(float *)((long)pvVar3 + uVar13 * 4);
        __x = fVar14 - fVar15;
        fVar16 = floorf(__x);
        fVar16 = __x - fVar16;
        iVar8 = (int)(__x - fVar16);
        if (fVar16 <= 0.5) {
          iVar8 = iVar8 + (uint)((byte)iVar8 & fVar16 == 0.5);
        }
        else {
          iVar8 = iVar8 + 1;
        }
        fVar14 = fVar14 + fVar15;
        fVar16 = floorf(fVar14);
        fVar16 = fVar14 - fVar16;
        iVar6 = (int)(fVar14 - fVar16);
        if (fVar16 <= 0.5) {
          iVar6 = iVar6 + (uint)((byte)iVar6 & fVar16 == 0.5);
        }
        else {
          iVar6 = iVar6 + 1;
        }
        iVar8 = (int)(float)iVar8;
        iVar6 = (int)(float)iVar6;
        if (iVar6 < iVar8) {
LAB_0046a5dd:
          poVar11 = &(this->super_CommonFunctionCase).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"Expected [",10);
          poVar7 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = [",5);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] with ULP threshold ",0x15);
          goto LAB_0046a72a;
        }
        iVar10 = iVar8;
        while( true ) {
          fVar14 = (float)iVar10;
          if ((fVar17 != 0.0) || (NAN(fVar17))) {
            fVar16 = ABS(fVar17);
            if (iVar10 != 0) {
              fVar16 = (float)((int)fVar14 - (int)fVar17);
              if ((uint)fVar14 < (uint)fVar17) {
                fVar16 = (float)-((int)fVar14 - (int)fVar17);
              }
            }
          }
          else {
            fVar16 = ABS(fVar14);
          }
          if ((uint)fVar16 <= (uint)fVar12) break;
          iVar10 = iVar10 + 1;
          if (iVar6 < iVar10) goto LAB_0046a5dd;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != local_48);
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];

				if (deFloatFrac(in0) == 0.5f)
				{
					// Allow both ceil(in) and floor(in)
					const float		ref0		= deFloatFloor(in0);
					const float		ref1		= deFloatCeil(in0);
					const deUint32	ulpDiff0	= hasZeroSign ? getUlpDiff(out0, ref0) : getUlpDiffIgnoreZeroSign(out0, ref0);
					const deUint32	ulpDiff1	= hasZeroSign ? getUlpDiff(out0, ref1) : getUlpDiffIgnoreZeroSign(out0, ref1);

					if (ulpDiff0 > 0 && ulpDiff1 > 0)
					{
						m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref0) << " or " << HexFloat(ref1) << ", got ULP diff " << tcu::toHex(de::min(ulpDiff0, ulpDiff1));
						return false;
					}
				}
				else
				{
					// Require exact result
					const float		ref		= roundEven(in0);
					const deUint32	ulpDiff	= hasZeroSign ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

					if (ulpDiff > 0)
					{
						m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
						return false;
					}
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(roundEven(in0-eps));
				const int		maxRes		= int(roundEven(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}